

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.h
# Opt level: O2

Matrix<float,_3,_1,_0,_3,_1> __thiscall
Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::eulerAngles
          (MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *this,Index a0,Index a1,Index a2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_R8;
  long lVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined4 extraout_XMM0_Db_00;
  undefined8 extraout_XMM0_Qa;
  float __x;
  Matrix<float,_3,_1,_0,_3,_1> MVar10;
  float local_6c;
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_40;
  undefined4 extraout_XMM0_Db;
  
  lVar2 = (a1 + 1) % 3;
  lVar3 = (long)(a1 + (ulong)(lVar2 != a2) + 1) % 3;
  lVar4 = (long)((a1 - (ulong)(lVar2 != a2)) + 2) % 3;
  if (a1 != in_R8) {
    lVar6 = lVar4 * 0xc + a0;
    local_6c = atan2f(*(float *)(lVar6 + lVar3 * 4),*(float *)(lVar6 + lVar4 * 4));
    lVar1 = a1 * 0xc + a0;
    lVar5 = lVar3 * 0xc + a0;
    *(float *)this = local_6c;
    fVar7 = *(float *)(lVar1 + a1 * 4);
    fVar8 = *(float *)(lVar5 + a1 * 4);
    fVar7 = SQRT(fVar8 * fVar8 + fVar7 * fVar7);
    if (lVar2 == a2) {
      if (0.0 < local_6c) goto LAB_001764ac;
LAB_001763b8:
      fVar7 = atan2f(-*(float *)(lVar6 + a1 * 4),fVar7);
    }
    else {
      if (0.0 <= local_6c) goto LAB_001763b8;
LAB_001764ac:
      local_6c = local_6c + *(float *)(&DAT_00183248 + (ulong)(0.0 < local_6c) * 4);
      *(float *)this = local_6c;
      fVar7 = atan2f(-*(float *)(lVar6 + a1 * 4),-fVar7);
    }
    *(float *)(this + 4) = fVar7;
    fVar7 = sinf(local_6c);
    fVar8 = cosf(local_6c);
    __x = fVar8 * *(float *)(lVar5 + lVar3 * 4) - fVar7 * *(float *)(lVar5 + lVar4 * 4);
    fVar7 = atan2f(*(float *)(lVar1 + lVar4 * 4) * fVar7 - *(float *)(lVar1 + lVar3 * 4) * fVar8,__x
                  );
    uVar9 = CONCAT44(extraout_XMM0_Db_00,fVar7);
    goto LAB_0017654f;
  }
  lVar5 = a1 * 0xc + a0;
  local_6c = atan2f(*(float *)(lVar5 + lVar3 * 4),*(float *)(lVar5 + lVar4 * 4));
  *(float *)this = local_6c;
  if (lVar2 == a2) {
    if (0.0 < local_6c) goto LAB_001763e6;
LAB_00176306:
    fVar7 = *(float *)(lVar5 + lVar3 * 4);
    fVar8 = *(float *)(lVar5 + lVar4 * 4);
    fVar7 = atan2f(SQRT(fVar8 * fVar8 + fVar7 * fVar7),*(float *)(lVar5 + a1 * 4));
  }
  else {
    if (0.0 <= local_6c) goto LAB_00176306;
LAB_001763e6:
    local_6c = local_6c + *(float *)(&DAT_00183248 + (ulong)(0.0 < local_6c) * 4);
    *(float *)this = local_6c;
    fVar7 = *(float *)(lVar5 + lVar3 * 4);
    fVar8 = *(float *)(lVar5 + lVar4 * 4);
    fVar7 = atan2f(SQRT(fVar8 * fVar8 + fVar7 * fVar7),*(float *)(lVar5 + a1 * 4));
    fVar7 = -fVar7;
  }
  *(float *)(this + 4) = fVar7;
  fVar7 = sinf(local_6c);
  fVar8 = cosf(local_6c);
  lVar5 = lVar4 * 0xc + a0;
  lVar1 = lVar3 * 0xc + a0;
  __x = fVar8 * *(float *)(lVar1 + lVar3 * 4) - fVar7 * *(float *)(lVar1 + lVar4 * 4);
  fVar7 = atan2f(*(float *)(lVar5 + lVar3 * 4) * fVar8 - *(float *)(lVar5 + lVar4 * 4) * fVar7,__x);
  uVar9 = CONCAT44(extraout_XMM0_Db,fVar7);
LAB_0017654f:
  *(int *)(this + 8) = (int)uVar9;
  if (lVar2 == a2) {
    local_40.m_xpr = (XprTypeNested)this;
    internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>>
              ((Matrix<float,_3,_1,_0,_3,_1> *)this,&local_40);
    uVar9 = extraout_XMM0_Qa;
  }
  MVar10.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = __x
  ;
  MVar10.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (float)(int)uVar9;
  MVar10.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (float)(int)((ulong)uVar9 >> 0x20);
  return (Matrix<float,_3,_1,_0,_3,_1>)
         MVar10.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
}

Assistant:

EIGEN_DEVICE_FUNC inline Matrix<typename MatrixBase<Derived>::Scalar,3,1>
MatrixBase<Derived>::eulerAngles(Index a0, Index a1, Index a2) const
{
  EIGEN_USING_STD(atan2)
  EIGEN_USING_STD(sin)
  EIGEN_USING_STD(cos)
  /* Implemented from Graphics Gems IV */
  EIGEN_STATIC_ASSERT_MATRIX_SPECIFIC_SIZE(Derived,3,3)

  Matrix<Scalar,3,1> res;
  typedef Matrix<typename Derived::Scalar,2,1> Vector2;

  const Index odd = ((a0+1)%3 == a1) ? 0 : 1;
  const Index i = a0;
  const Index j = (a0 + 1 + odd)%3;
  const Index k = (a0 + 2 - odd)%3;
  
  if (a0==a2)
  {
    res[0] = atan2(coeff(j,i), coeff(k,i));
    if((odd && res[0]<Scalar(0)) || ((!odd) && res[0]>Scalar(0)))
    {
      if(res[0] > Scalar(0)) {
        res[0] -= Scalar(EIGEN_PI);
      }
      else {
        res[0] += Scalar(EIGEN_PI);
      }
      Scalar s2 = Vector2(coeff(j,i), coeff(k,i)).norm();
      res[1] = -atan2(s2, coeff(i,i));
    }
    else
    {
      Scalar s2 = Vector2(coeff(j,i), coeff(k,i)).norm();
      res[1] = atan2(s2, coeff(i,i));
    }
    
    // With a=(0,1,0), we have i=0; j=1; k=2, and after computing the first two angles,
    // we can compute their respective rotation, and apply its inverse to M. Since the result must
    // be a rotation around x, we have:
    //
    //  c2  s1.s2 c1.s2                   1  0   0 
    //  0   c1    -s1       *    M    =   0  c3  s3
    //  -s2 s1.c2 c1.c2                   0 -s3  c3
    //
    //  Thus:  m11.c1 - m21.s1 = c3  &   m12.c1 - m22.s1 = s3
    
    Scalar s1 = sin(res[0]);
    Scalar c1 = cos(res[0]);
    res[2] = atan2(c1*coeff(j,k)-s1*coeff(k,k), c1*coeff(j,j) - s1 * coeff(k,j));
  } 
  else
  {
    res[0] = atan2(coeff(j,k), coeff(k,k));
    Scalar c2 = Vector2(coeff(i,i), coeff(i,j)).norm();
    if((odd && res[0]<Scalar(0)) || ((!odd) && res[0]>Scalar(0))) {
      if(res[0] > Scalar(0)) {
        res[0] -= Scalar(EIGEN_PI);
      }
      else {
        res[0] += Scalar(EIGEN_PI);
      }
      res[1] = atan2(-coeff(i,k), -c2);
    }
    else
      res[1] = atan2(-coeff(i,k), c2);
    Scalar s1 = sin(res[0]);
    Scalar c1 = cos(res[0]);
    res[2] = atan2(s1*coeff(k,i)-c1*coeff(j,i), c1*coeff(j,j) - s1 * coeff(k,j));
  }
  if (!odd)
    res = -res;
  
  return res;
}